

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

collision_shape_ptr __thiscall
APhyBullet::BulletEngine::createCapsuleShapeX
          (BulletEngine *this,aphy_scalar radius,aphy_scalar height)

{
  Counter *pCVar1;
  btCapsuleShapeX *in_stack_ffffffffffffffb8;
  ref<aphy::collision_shape> *this_00;
  btScalar in_stack_ffffffffffffffd8;
  btScalar in_stack_ffffffffffffffdc;
  btCapsuleShapeX *in_stack_ffffffffffffffe0;
  ref<aphy::collision_shape> local_18 [3];
  
  btCapsuleShape::operator_new(0x127fef);
  btCapsuleShapeX::btCapsuleShapeX
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  this_00 = local_18;
  aphy::makeObject<APhyBullet::BulletCollisionShape,btCapsuleShapeX*>(in_stack_ffffffffffffffb8);
  pCVar1 = aphy::ref<aphy::collision_shape>::disown(this_00);
  aphy::ref<aphy::collision_shape>::~ref(this_00);
  return pCVar1;
}

Assistant:

collision_shape_ptr BulletEngine::createCapsuleShapeX(aphy_scalar radius, aphy_scalar height)
{
    return makeObject<BulletCollisionShape> (
        new btCapsuleShapeX(radius, height)
    ).disown();
}